

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  if ((gen->ConfiguredFilesPath)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfiguredFilesPath);
    return;
  }
  cmake::GetHomeOutputDirectory(gen->CMakeInstance);
  std::__cxx11::string::assign((char *)&this->ConfiguredFilesPath);
  std::__cxx11::string::append((char *)&this->ConfiguredFilesPath);
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if(!gen->ConfiguredFilesPath.empty())
    {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
    }
  else
    {
    this->ConfiguredFilesPath = gen->CMakeInstance->GetHomeOutputDirectory();
    this->ConfiguredFilesPath += cmake::GetCMakeFilesDirectory();
    }
}